

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O0

void CPU::WDC65816::ProcessorStorageConstructor::read_write
               (AccessType type,bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  function<void_(CPU::WDC65816::MicroOp)> *target_local;
  bool is8bit_local;
  AccessType type_local;
  
  if (type == Write) {
    std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationPerform);
    if (!is8bit) {
      std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleStoreIncrementData);
    }
    std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleStoreData);
  }
  else {
    if (!is8bit) {
      std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementData);
    }
    std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchData);
    std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationPerform);
  }
  return;
}

Assistant:

static void read_write(AccessType type, bool is8bit, const std::function<void(MicroOp)> &target) {
		if(type == AccessType::Write) {
			target(OperationPerform);						// Perform operation to fill the data buffer.
			if(!is8bit) target(CycleStoreIncrementData);	// Data low.
			target(CycleStoreData);							// Data [high].
		} else {
			if(!is8bit) target(CycleFetchIncrementData);	// Data low.
			target(CycleFetchData);							// Data [high].
			target(OperationPerform);						// Perform operation from the data buffer.
		}
	}